

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_resampler.cpp
# Opt level: O3

void __thiscall crnlib::threaded_resampler::free_contrib_lists(threaded_resampler *this)

{
  Contrib_List *pCVar1;
  
  if (this->m_pX_contribs != (Contrib_List *)0x0) {
    crnlib_free(this->m_pX_contribs->p);
    pCVar1 = this->m_pX_contribs;
    pCVar1->p = (Contrib *)0x0;
    crnlib_free(pCVar1);
    this->m_pX_contribs = (Contrib_List *)0x0;
  }
  if (this->m_pY_contribs != (Contrib_List *)0x0) {
    crnlib_free(this->m_pY_contribs->p);
    pCVar1 = this->m_pY_contribs;
    pCVar1->p = (Contrib *)0x0;
    crnlib_free(pCVar1);
    this->m_pY_contribs = (Contrib_List *)0x0;
  }
  return;
}

Assistant:

void threaded_resampler::free_contrib_lists()
    {
        if (m_pX_contribs)
        {
            crnlib_free(m_pX_contribs->p);
            m_pX_contribs->p = nullptr;

            crnlib_free(m_pX_contribs);
            m_pX_contribs = nullptr;
        }

        if (m_pY_contribs)
        {
            crnlib_free(m_pY_contribs->p);
            m_pY_contribs->p = nullptr;

            crnlib_free(m_pY_contribs);
            m_pY_contribs = nullptr;
        }
    }